

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

bool IsValidBailOutKindAndBits(BailOutKind bailOutKind)

{
  BailOutKind BVar1;
  BailOutKind e0;
  BailOutKind kindNoBits;
  BailOutKind bailOutKind_local;
  
  BVar1 = IR::operator~(BailOutKindBits);
  BVar1 = IR::operator&(bailOutKind,BVar1);
  if (BVar1 < BailOutKindBitsStart) {
    e0 = IR::operator&(bailOutKind,BailOutKindBits);
    BVar1 = IR::operator~(BailOutKindValidBits[BVar1]);
    BVar1 = IR::operator&(e0,BVar1);
    kindNoBits._3_1_ = BVar1 == BailOutInvalid;
  }
  else {
    kindNoBits._3_1_ = BailOutInvalid >> 0x18;
  }
  return (bool)kindNoBits._3_1_;
}

Assistant:

bool IsValidBailOutKindAndBits(IR::BailOutKind bailOutKind)
{
    IR::BailOutKind kindNoBits = bailOutKind & ~IR::BailOutKindBits;
    if (kindNoBits >= IR::BailOutKindBitsStart)
    {
        return false;
    }
    return ((bailOutKind & IR::BailOutKindBits) & ~BailOutKindValidBits[kindNoBits]) == 0;
}